

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportTargetCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target,
          TargetType param_3)

{
  cmTarget *this_00;
  ostream *poVar1;
  string *psVar2;
  string config;
  string targetName;
  undefined1 local_c8 [48];
  cmAlphaNum local_98;
  string local_68;
  string local_48;
  
  local_c8._8_8_ =
       (this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Namespace._M_dataplus.
       _M_p;
  local_c8._0_8_ =
       (this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Namespace.
       _M_string_length;
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_48,target);
  local_98.View_._M_len = local_48._M_string_length;
  local_98.View_._M_str = local_48._M_dataplus._M_p;
  cmStrCat<>(&local_68,(cmAlphaNum *)local_c8,&local_98);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar1 = std::operator<<(os,(string *)&local_68);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/");
  this_00 = target->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"__dest",(allocator<char> *)&local_98);
  psVar2 = cmTarget::GetSafeProperty(this_00,(string *)local_c8);
  poVar1 = std::operator<<(os,(string *)psVar2);
  std::operator<<(poVar1,"/");
  std::__cxx11::string::~string((string *)local_c8);
  local_c8._0_8_ = local_c8 + 0x10;
  local_c8._8_8_ = (char *)0x0;
  local_c8[0x10] = '\0';
  if ((this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)local_c8);
  }
  cmGeneratorTarget::GetFullName
            ((string *)&local_98,target,(string *)local_c8,RuntimeBinaryArtifact);
  poVar1 = std::operator<<(os,(string *)&local_98);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType /*targetType*/)
{
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/";
  os << target->Target->GetSafeProperty("__dest") << "/";
  std::string config;
  if (!this->Configurations.empty()) {
    config = this->Configurations[0];
  }
  os << target->GetFullName(config) << "\n";
}